

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_BasicRepeatedFieldOrderingInequalityTest_Test::
~MessageDifferencerTest_BasicRepeatedFieldOrderingInequalityTest_Test
          (MessageDifferencerTest_BasicRepeatedFieldOrderingInequalityTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageDifferencerTest, BasicRepeatedFieldOrderingInequalityTest) {
  // Create the testing protos
  unittest::MoreString msg1;
  unittest::MoreString msg2;

  msg1.add_data("a");
  msg1.add_data("b");
  msg2.add_data("b");
  msg2.add_data("a");

  // Compare
  EXPECT_FALSE(util::MessageDifferencer::Equals(msg1, msg2));
  EXPECT_FALSE(util::MessageDifferencer::Equivalent(msg1, msg2));
}